

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  byte bVar1;
  Extension *pEVar2;
  Nonnull<const_char_*> failure_msg;
  int line;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  anon_enum_32 local_34;
  LogMessageFatal local_30;
  
  pVar3 = Insert(this,number);
  pEVar2 = pVar3.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_30.super_LogMessage.errno_saver_.saved_errno_ = pEVar2->is_repeated ^ CPPTYPE_INT32;
    local_34 = OPTIONAL_FIELD;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                            ((anon_enum_32 *)&local_30,&local_34,
                             "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_30.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar2->type);
      local_34 = 8;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                              ((CppType *)&local_30,&local_34,
                               "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        bVar1 = pEVar2->field_0xa;
        goto LAB_00c554d5;
      }
    }
    line = 0x1f7;
  }
  else {
    pEVar2->type = type;
    local_30.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(type);
    local_34 = 8;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_30,&local_34,
                             "cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pEVar2->is_repeated = false;
      bVar1 = pEVar2->field_0xa & 0xfe;
LAB_00c554d5:
      pEVar2->field_0xa = bVar1 & 0xfd;
      (pEVar2->field_0).enum_value = value;
      return;
    }
    line = 499;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
    extension->is_pointer = false;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}